

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::SeekToLast(Iter *this)

{
  bool bVar1;
  uint32_t uVar2;
  bool bVar3;
  Iter *this_local;
  
  SeekToRestartPoint(this,this->num_restarts_ - 1);
  do {
    bVar1 = ParseNextKey(this);
    bVar3 = false;
    if (bVar1) {
      uVar2 = NextEntryOffset(this);
      bVar3 = uVar2 < this->restarts_;
    }
  } while (bVar3);
  return;
}

Assistant:

void SeekToLast() override {
    SeekToRestartPoint(num_restarts_ - 1);
    while (ParseNextKey() && NextEntryOffset() < restarts_) {
      // Keep skipping
    }
  }